

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTagSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index tag_index)

{
  Module *pMVar1;
  bool bVar2;
  size_type sVar3;
  reference ppTVar4;
  string_view name_00;
  Binding local_b8;
  BinaryReaderIR *local_90;
  size_t local_88;
  string local_80;
  undefined1 local_60 [8];
  string dollar_name;
  Tag *tag;
  Index tag_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderIR *)name._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  }
  else {
    sVar3 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::size(&this->module_->tags);
    if (tag_index < sVar3) {
      ppTVar4 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::operator[]
                          (&this->module_->tags,(ulong)tag_index);
      dollar_name.field_2._8_8_ = *ppTVar4;
      pMVar1 = this->module_;
      local_90 = this_local;
      local_88 = name_local._M_len;
      name_00._M_str = (char *)dollar_name.field_2._8_8_;
      name_00._M_len = name_local._M_len;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)this_local,name_00);
      GetUniqueName((string *)local_60,this,&pMVar1->tag_bindings,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::operator=((string *)dollar_name.field_2._8_8_,(string *)local_60);
      pMVar1 = this->module_;
      Binding::Binding(&local_b8,tag_index);
      std::
      unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
      ::emplace<std::__cxx11::string&,wabt::Binding>
                ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&pMVar1->tag_bindings,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_b8);
      Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      PrintError(this,"invalid tag index: %u",(ulong)tag_index);
      Result::Result((Result *)((long)&name_local._M_str + 4),Error);
    }
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTagSymbol(Index index,
                                   uint32_t flags,
                                   std::string_view name,
                                   Index tag_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (tag_index >= module_->tags.size()) {
    PrintError("invalid tag index: %" PRIindex, tag_index);
    return Result::Error;
  }
  Tag* tag = module_->tags[tag_index];
  std::string dollar_name =
      GetUniqueName(&module_->tag_bindings, MakeDollarName(name));
  tag->name = dollar_name;
  module_->tag_bindings.emplace(dollar_name, Binding(tag_index));
  return Result::Ok;
}